

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O3

Var Js::JavascriptFunction::CallSpreadFunction
              (RecyclableObject *function,Arguments *args,AuxArray<unsigned_int> *spreadIndices)

{
  ScriptContext *scriptContext;
  long lVar1;
  size_t __n;
  uint count;
  uint uVar2;
  JavascriptMethod entryPoint;
  Var pvVar3;
  Type scriptContext_00;
  Type TVar4;
  void **__s;
  ulong uVar5;
  void *apvStack_d0 [2];
  Var stackArgs [8];
  Arguments local_80;
  Arguments local_70;
  Arguments local_60;
  Arguments local_50;
  AuxArray<unsigned_int> *local_40;
  size_t local_38;
  
  scriptContext =
       (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
       scriptContext.ptr;
  local_80.Info = args->Info;
  local_80.Values = args->Values;
  apvStack_d0[0] = (void *)0xbc6821;
  count = GetSpreadSize(&local_80,spreadIndices,scriptContext);
  apvStack_d0[0] = (void *)0xbc6830;
  uVar2 = CallInfo::GetLargeArgCountWithExtraArgs((uint)(byte)(args->Info).field_0x3,count);
  scriptContext_00 = args->Info;
  TVar4._0_4_ = count & 0xffffff | scriptContext_00._0_4_ & 0xff000000;
  TVar4._4_4_ = 0;
  local_50.Info = TVar4;
  if (uVar2 < 9) {
    __s = apvStack_d0 + 1;
    stackArgs[5] = (Var)0x0;
    stackArgs[6] = (Var)0x0;
    stackArgs[3] = (Var)0x0;
    stackArgs[4] = (Var)0x0;
    stackArgs[1] = (Var)0x0;
    stackArgs[2] = (Var)0x0;
    apvStack_d0[1] = (void *)0x0;
    stackArgs[0] = (Var)0x0;
  }
  else {
    uVar5 = (ulong)uVar2;
    local_38 = uVar5 * 8;
    apvStack_d0[0] = (void *)0xbc687a;
    local_40 = spreadIndices;
    ThreadContext::ProbeStack
              (scriptContext->threadContext,uVar5 * 8 + 0xc00,scriptContext,(PVOID)0x0);
    __n = local_38;
    spreadIndices = local_40;
    lVar1 = -(uVar5 * 8 + 0xf & 0xfffffffffffffff0);
    __s = (void **)((long)stackArgs + lVar1 + -8);
    *(undefined8 *)((long)apvStack_d0 + lVar1) = 0xbc68a1;
    memset(__s,0,__n);
    scriptContext_00 = args->Info;
  }
  local_70.Values = args->Values;
  local_70.Info = scriptContext_00;
  local_50.Values = __s;
  __s[-1] = (void *)0xbc68e3;
  SpreadArgs(&local_70,&local_50,spreadIndices,(ScriptContext *)scriptContext_00);
  __s[-1] = (void *)0xbc68eb;
  entryPoint = RecyclableObject::GetEntryPoint(function);
  local_60.Info = TVar4;
  local_60.Values = __s;
  __s[-1] = (void *)0xbc6906;
  pvVar3 = CallFunction<true>(function,entryPoint,&local_60,true);
  return pvVar3;
}

Assistant:

Var JavascriptFunction::CallSpreadFunction(RecyclableObject* function, Arguments args, const Js::AuxArray<uint32> *spreadIndices)
    {
        ScriptContext* scriptContext = function->GetScriptContext();

        // Work out the expanded number of arguments.
        uint spreadSize = GetSpreadSize(args, spreadIndices, scriptContext);
        uint32 actualLength = CallInfo::GetLargeArgCountWithExtraArgs(args.Info.Flags, spreadSize);

        // Allocate (if needed) space for the expanded arguments.
        Arguments outArgs(CallInfo(args.Info.Flags, spreadSize), nullptr);
        Var stackArgs[STACK_ARGS_ALLOCA_THRESHOLD];
        size_t outArgsSize = 0;
        if (actualLength > STACK_ARGS_ALLOCA_THRESHOLD)
        {
            PROBE_STACK(scriptContext, actualLength * sizeof(Var) + Js::Constants::MinStackDefault); // args + function call
            outArgsSize = actualLength * sizeof(Var);
            outArgs.Values = (Var*)_alloca(outArgsSize);
            ZeroMemory(outArgs.Values, outArgsSize);
        }
        else
        {
            outArgs.Values = stackArgs;
            outArgsSize = STACK_ARGS_ALLOCA_THRESHOLD * sizeof(Var);
            ZeroMemory(outArgs.Values, outArgsSize); // We may not use all of the elements
        }

        SpreadArgs(args, outArgs, spreadIndices, scriptContext);

        // Number of arguments are allowed to be more than Constants::MaxAllowedArgs in runtime. Need to use the large argcount logic in this case.
        return JavascriptFunction::CallFunction<true>(function, function->GetEntryPoint(), outArgs, true);
    }